

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

void __thiscall
llama_context::set_abort_callback
          (llama_context *this,_func_bool_void_ptr *abort_callback,void *abort_callback_data)

{
  bool bVar1;
  pointer pgVar2;
  undefined8 uVar3;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *pvVar4;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *in_RDX;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *in_RSI;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  *in_RDI;
  _func_void_ggml_backend_t_ggml_abort_callback_void_ptr *set_abort_callback_fn;
  ggml_backend_reg *reg;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *backend;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *__range1;
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  local_28;
  __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
  *local_20;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *local_18;
  unique_ptr<ggml_backend,_ggml_backend_deleter> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  llama_log_internal(GGML_LOG_LEVEL_DEBUG,"%s: call\n","set_abort_callback");
  in_RDI[0x5c]._M_current = local_10;
  in_RDI[0x5d]._M_current = local_18;
  local_20 = in_RDI + 0x56;
  local_28._M_current =
       (unique_ptr<ggml_backend,_ggml_backend_deleter> *)
       std::
       vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
    ::operator*(&local_28);
    pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                       ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)in_RDI);
    uVar3 = ggml_backend_get_device(pgVar2);
    uVar3 = ggml_backend_dev_backend_reg(uVar3);
    pvVar4 = (vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
              *)ggml_backend_reg_get_proc_address(uVar3,"ggml_backend_set_abort_callback");
    if (pvVar4 != (vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>
                   *)0x0) {
      pgVar2 = std::unique_ptr<ggml_backend,_ggml_backend_deleter>::get
                         ((unique_ptr<ggml_backend,_ggml_backend_deleter> *)in_RDI);
      (*(code *)pvVar4)(pgVar2,in_RDI[0x5c]._M_current,in_RDI[0x5d]._M_current);
      in_stack_ffffffffffffffa8 = pvVar4;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_*,_std::vector<std::unique_ptr<ggml_backend,_ggml_backend_deleter>,_std::allocator<std::unique_ptr<ggml_backend,_ggml_backend_deleter>_>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void llama_context::set_abort_callback(bool (*abort_callback)(void * data), void * abort_callback_data) {
    LLAMA_LOG_DEBUG("%s: call\n", __func__);

    this->abort_callback      = abort_callback;
    this->abort_callback_data = abort_callback_data;

    for (auto & backend : backends) {
        auto * reg = ggml_backend_dev_backend_reg(ggml_backend_get_device(backend.get()));
        auto * set_abort_callback_fn = (ggml_backend_set_abort_callback_t) ggml_backend_reg_get_proc_address(reg, "ggml_backend_set_abort_callback");
        if (set_abort_callback_fn) {
            set_abort_callback_fn(backend.get(), this->abort_callback, this->abort_callback_data);
        }
    }
}